

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O0

void __thiscall
libcellml::Validator::ValidatorImpl::validateUnits
          (ValidatorImpl *this,UnitsPtr *units,History *history,
          vector<std::shared_ptr<libcellml::Model>,_std::allocator<std::shared_ptr<libcellml::Model>_>_>
          *modelsVisited,string *sourceUrl)

{
  IssueImpl *pIVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  __type _Var4;
  ulong uVar5;
  element_type *peVar6;
  size_t initialErrorCount;
  size_type sVar7;
  element_type *peVar8;
  element_type *peVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  size_type sVar11;
  string *name;
  element_type *peVar12;
  element_type *peVar13;
  element_type *peVar14;
  size_t sVar15;
  __type local_afc;
  shared_ptr<libcellml::Component> local_a90;
  allocator<char> local_a79;
  string local_a78;
  ulong local_a58;
  size_t i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0;
  allocator<char> local_989;
  undefined1 local_988 [8];
  string descriptionStart;
  IssuePtr issue_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_938;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_918;
  undefined1 local_8f8 [8];
  IssuePtr issue_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_888;
  string local_868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808;
  undefined1 local_7e8 [8];
  IssuePtr issue_6;
  IssuePtr issue_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  undefined1 local_748 [8];
  string description_2;
  string local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  undefined1 local_628 [8];
  IssuePtr issue_4;
  undefined1 local_5f8 [8];
  IssuePtr issue_3;
  string local_5e0;
  undefined1 local_5c0 [8];
  string description_1;
  IssuesList importIssueList;
  Strings importUnitsImportSources;
  Strings importUnitsRefs;
  Strings importUnitsNames;
  UnitsPtr importedUnits;
  ModelPtr importSourceModel;
  IssuePtr issue_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  undefined1 local_450 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> description;
  undefined1 local_428 [6];
  bool foundImportIssue;
  undefined1 local_408 [8];
  ImportSourcePtr importSource;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  undefined1 local_378 [8];
  IssuePtr issue_1;
  size_t currentIssueCount;
  ImportedEntity local_358;
  string local_348;
  string local_328;
  string local_308;
  UnitsPtr tmpUnits;
  size_t i;
  size_t unitsWithImportSource;
  size_t unitsWithNameCount;
  undefined1 local_2b0 [8];
  ModelPtr model;
  string local_290;
  string local_270;
  ImportedEntity local_250;
  string local_240;
  string local_220;
  undefined1 local_200 [8];
  string unitsImportUrl;
  string unitsRef;
  bool isOriginatingModel;
  size_t initialIssueCount;
  string unitsName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined1 local_148 [8];
  IssuePtr issue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 local_100 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tmp;
  shared_ptr<libcellml::HistoryEpoch> *entry;
  iterator __end2;
  iterator __begin2;
  History *__range2;
  Strings names;
  string des;
  allocator<char> local_71;
  string local_70;
  UnitsConstPtr local_50;
  undefined1 local_40 [8];
  HistoryEpochPtr h;
  string *sourceUrl_local;
  vector<std::shared_ptr<libcellml::Model>,_std::allocator<std::shared_ptr<libcellml::Model>_>_>
  *modelsVisited_local;
  History *history_local;
  UnitsPtr *units_local;
  ValidatorImpl *this_local;
  
  h.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sourceUrl;
  std::shared_ptr<libcellml::Units_const>::shared_ptr<libcellml::Units,void>
            ((shared_ptr<libcellml::Units_const> *)&local_50,units);
  _Var2._M_pi = h.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
  createHistoryEpoch((libcellml *)local_40,&local_50,(string *)_Var2._M_pi,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::shared_ptr<const_libcellml::Units>::~shared_ptr(&local_50);
  bVar3 = checkForLocalCycles(history,(HistoryEpochPtr *)local_40);
  if (bVar3) {
    std::
    vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
    ::push_back(history,(value_type *)local_40);
    std::__cxx11::string::string
              ((string *)
               &names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range2);
    __end2 = std::
             vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
             ::begin(history);
    entry = (shared_ptr<libcellml::HistoryEpoch> *)
            std::
            vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
            ::end(history);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::shared_ptr<libcellml::HistoryEpoch>_*,_std::vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>_>
                                       *)&entry), bVar3) {
      tmp.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<std::shared_ptr<libcellml::HistoryEpoch>_*,_std::vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>_>
           ::operator*(&__end2);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::__cxx11::string::operator+=
                  ((string *)
                   &names.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage," -> ");
      }
      peVar8 = std::
               __shared_ptr_access<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)tmp.field_2._8_8_);
      std::operator+(&local_120,"\'",&peVar8->mName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                     &local_120,"\'");
      std::__cxx11::string::~string((string *)&local_120);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range2,(value_type *)local_100);
      std::__cxx11::string::operator+=
                ((string *)
                 &names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_100);
      std::__cxx11::string::~string((string *)local_100);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<libcellml::HistoryEpoch>_*,_std::vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range2);
    bVar3 = hasCycleAlreadyBeenReported
                      (this,(NameList *)
                            &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             );
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      Issue::IssueImpl::create();
      peVar13 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_148);
      pIVar1 = peVar13->mPimpl;
      std::operator+(&local_188,"Cyclic units exist: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator+(&local_168,&local_188,".");
      Issue::IssueImpl::setDescription(pIVar1,&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_188);
      peVar13 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_148);
      peVar14 = std::
                __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&peVar13->mPimpl->mItem);
      AnyCellmlElement::AnyCellmlElementImpl::setUnits(peVar14->mPimpl,units);
      peVar13 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_148);
      Issue::IssueImpl::setReferenceRule(peVar13->mPimpl,UNIT_UNITS_CIRCULAR_REFERENCE);
      Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_148);
      std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_148);
    }
    std::
    vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
    ::pop_back(history);
    unitsName.field_2._12_4_ = 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2);
    std::__cxx11::string::~string
              ((string *)
               &names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    peVar6 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)units);
    NamedEntity::name_abi_cxx11_((string *)&initialIssueCount,&peVar6->super_NamedEntity);
    initialErrorCount = Logger::issueCount(&this->mValidator->super_Logger);
    sVar7 = std::
            vector<std::shared_ptr<libcellml::Model>,_std::allocator<std::shared_ptr<libcellml::Model>_>_>
            ::size(modelsVisited);
    std::__cxx11::string::string((string *)(unitsImportUrl.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_200);
    peVar6 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)units);
    bVar3 = ImportedEntity::isImport(&peVar6->super_ImportedEntity);
    if (bVar3) {
      peVar6 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)units);
      ImportedEntity::importReference_abi_cxx11_(&local_220,&peVar6->super_ImportedEntity);
      std::__cxx11::string::operator=
                ((string *)(unitsImportUrl.field_2._M_local_buf + 8),(string *)&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 units);
      ImportedEntity::importSource(&local_250);
      peVar12 = std::
                __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&local_250);
      ImportSource::url_abi_cxx11_(&local_240,peVar12);
      std::__cxx11::string::operator=((string *)local_200,(string *)&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      std::shared_ptr<libcellml::ImportSource>::~shared_ptr
                ((shared_ptr<libcellml::ImportSource> *)&local_250);
      peVar8 = std::
               __shared_ptr_access<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_40);
      std::__cxx11::string::operator=
                ((string *)&peVar8->mReferenceName,
                 (string *)(unitsImportUrl.field_2._M_local_buf + 8));
      std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 units);
      ImportedEntity::importSource
                ((ImportedEntity *)
                 &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      peVar12 = std::
                __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&model.
                                 super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount);
      ImportSource::url_abi_cxx11_(&local_290,peVar12);
      importeeModelUrl(&local_270,history,&local_290);
      peVar8 = std::
               __shared_ptr_access<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_40);
      std::__cxx11::string::operator=((string *)&peVar8->mSourceUrl,(string *)&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_290);
      std::shared_ptr<libcellml::ImportSource>::~shared_ptr
                ((shared_ptr<libcellml::ImportSource> *)
                 &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
    }
    std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Units,void>
              ((shared_ptr<libcellml::ParentedEntity_const> *)&unitsWithNameCount,units);
    owningModel((libcellml *)local_2b0,(ParentedEntityConstPtr *)&unitsWithNameCount);
    std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr
              ((shared_ptr<const_libcellml::ParentedEntity> *)&unitsWithNameCount);
    unitsWithImportSource = 0;
    i = 0;
    tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    while( true ) {
      _Var2._M_pi = tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      peVar9 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_2b0);
      p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Model::unitsCount(peVar9);
      bVar3 = false;
      if (_Var2._M_pi < p_Var10) {
        sVar11 = std::
                 vector<std::shared_ptr<libcellml::Model>,_std::allocator<std::shared_ptr<libcellml::Model>_>_>
                 ::size(modelsVisited);
        bVar3 = sVar11 == 1;
      }
      if (!bVar3) break;
      peVar9 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_2b0);
      Model::units((Model *)&stack0xfffffffffffffd18,(size_t)peVar9);
      peVar6 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&stack0xfffffffffffffd18);
      NamedEntity::name_abi_cxx11_(&local_308,&peVar6->super_NamedEntity);
      _Var4 = std::operator==(&local_308,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &initialIssueCount);
      std::__cxx11::string::~string((string *)&local_308);
      if (_Var4) {
        unitsWithImportSource = unitsWithImportSource + 1;
      }
      peVar6 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&stack0xfffffffffffffd18);
      bVar3 = ImportedEntity::isImport(&peVar6->super_ImportedEntity);
      if (bVar3) {
        peVar6 = std::
                 __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&stack0xfffffffffffffd18);
        ImportedEntity::importReference_abi_cxx11_(&local_328,&peVar6->super_ImportedEntity);
        _Var4 = std::operator==(&local_328,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&unitsImportUrl.field_2 + 8));
        local_afc = false;
        if (_Var4) {
          std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&stack0xfffffffffffffd18);
          ImportedEntity::importSource(&local_358);
          peVar12 = std::
                    __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&local_358);
          ImportSource::url_abi_cxx11_(&local_348,peVar12);
          local_afc = std::operator==(&local_348,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_200);
          std::__cxx11::string::~string((string *)&local_348);
          std::shared_ptr<libcellml::ImportSource>::~shared_ptr
                    ((shared_ptr<libcellml::ImportSource> *)&local_358);
        }
        std::__cxx11::string::~string((string *)&local_328);
        if (local_afc != false) {
          i = i + 1;
        }
      }
      std::shared_ptr<libcellml::Units>::~shared_ptr
                ((shared_ptr<libcellml::Units> *)&stack0xfffffffffffffd18);
      tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1);
    }
    peVar6 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)units);
    bVar3 = ImportedEntity::isImport(&peVar6->super_ImportedEntity);
    if (bVar3) {
      issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           Logger::issueCount(&this->mValidator->super_Logger);
      bVar3 = isCellmlIdentifier((string *)((long)&unitsImportUrl.field_2 + 8));
      if (!bVar3) {
        makeIssueIllegalIdentifier((ValidatorImpl *)local_378,(string *)this);
        peVar13 = std::
                  __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_378);
        pIVar1 = peVar13->mPimpl;
        std::operator+(&local_3d8,"Imported units \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &initialIssueCount);
        std::operator+(&local_3b8,&local_3d8,"\' does not have a valid units_ref attribute. ");
        peVar13 = std::
                  __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_378);
        Issue::description_abi_cxx11_
                  ((string *)
                   &importSource.
                    super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,peVar13);
        std::operator+(&local_398,&local_3b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &importSource.
                        super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
        Issue::IssueImpl::setDescription(pIVar1,&local_398);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string
                  ((string *)
                   &importSource.
                    super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__cxx11::string::~string((string *)&local_3b8);
        std::__cxx11::string::~string((string *)&local_3d8);
        peVar13 = std::
                  __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_378);
        peVar14 = std::
                  __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&peVar13->mPimpl->mItem);
        AnyCellmlElement::AnyCellmlElementImpl::setUnits(peVar14->mPimpl,units);
        peVar13 = std::
                  __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_378);
        Issue::IssueImpl::setReferenceRule(peVar13->mPimpl,IMPORT_UNITS_UNITS_REFERENCE_VALUE);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_378);
        std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_378);
      }
      std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 units);
      ImportedEntity::importSource((ImportedEntity *)local_408);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_428,"units",
                 (allocator<char> *)(description.field_2._M_local_buf + 0xf));
      validateImportSource
                (this,(ImportSourcePtr *)local_408,(string *)&initialIssueCount,(string *)local_428)
      ;
      std::__cxx11::string::~string((string *)local_428);
      std::allocator<char>::~allocator((allocator<char> *)(description.field_2._M_local_buf + 0xf));
      p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                Logger::issueCount(&this->mValidator->super_Logger);
      description.field_2._M_local_buf[0xe] =
           issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi < p_Var10;
      if ((!(bool)description.field_2._M_local_buf[0xe]) && (1 < i)) {
        peVar9 = std::
                 __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_2b0);
        NamedEntity::name_abi_cxx11_
                  ((string *)
                   &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(NamedEntity *)peVar9);
        std::operator+(&local_4f0,"Model \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
        std::operator+(&local_4d0,&local_4f0,"\' contains multiple imported units from \'");
        std::operator+(&local_4b0,&local_4d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_200);
        std::operator+(&local_490,&local_4b0,"\' with the same units_ref attribute \'");
        std::operator+(&local_470,&local_490,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&unitsImportUrl.field_2 + 8));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_450,&local_470,"\'.");
        std::__cxx11::string::~string((string *)&local_470);
        std::__cxx11::string::~string((string *)&local_490);
        std::__cxx11::string::~string((string *)&local_4b0);
        std::__cxx11::string::~string((string *)&local_4d0);
        std::__cxx11::string::~string((string *)&local_4f0);
        std::__cxx11::string::~string
                  ((string *)
                   &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        bVar3 = checkIssuesForDuplications(this,(string *)local_450);
        if (!bVar3) {
          Issue::IssueImpl::create();
          peVar13 = std::
                    __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&importSourceModel.
                                     super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount);
          Issue::IssueImpl::setDescription(peVar13->mPimpl,(string *)local_450);
          peVar13 = std::
                    __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&importSourceModel.
                                     super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount);
          peVar14 = std::
                    __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&peVar13->mPimpl->mItem);
          AnyCellmlElement::AnyCellmlElementImpl::setModel
                    (peVar14->mPimpl,(ModelPtr *)local_2b0,MODEL);
          peVar13 = std::
                    __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&importSourceModel.
                                     super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount);
          Issue::IssueImpl::setReferenceRule(peVar13->mPimpl,IMPORT_UNITS_UNITS_REFERENCE);
          Logger::LoggerImpl::addIssue
                    (&this->super_LoggerImpl,
                     (IssuePtr *)
                     &importSourceModel.
                      super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::shared_ptr<libcellml::Issue>::~shared_ptr
                    ((shared_ptr<libcellml::Issue> *)
                     &importSourceModel.
                      super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        }
        std::__cxx11::string::~string((string *)local_450);
      }
      std::__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)local_408);
      ImportSource::model((ImportSource *)
                          &importedUnits.
                           super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
      bVar3 = std::operator!=((shared_ptr<libcellml::Model> *)
                              &importedUnits.
                               super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount,(nullptr_t)0x0);
      if (bVar3) {
        name = (string *)
               std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&importedUnits.
                                super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
        Model::units((Model *)&importUnitsNames.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,name);
        bVar3 = std::operator!=((shared_ptr<libcellml::Units> *)
                                &importUnitsNames.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(nullptr_t)0x0);
        if (bVar3) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&importUnitsRefs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&importUnitsImportSources.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&importIssueList.
                       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)((long)&description_1.field_2 + 8));
          bVar3 = checkForImportCycles(history,(HistoryEpochPtr *)local_40);
          if (bVar3) {
            std::
            vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
            ::push_back(history,(value_type *)local_40);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_5e0,"resolve",
                       (allocator<char> *)
                       ((long)&issue_3.
                               super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi + 7));
            formDescriptionOfCyclicDependency((string *)local_5c0,history,&local_5e0);
            std::__cxx11::string::~string((string *)&local_5e0);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&issue_3.
                               super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi + 7));
            Issue::IssueImpl::create();
            peVar13 = std::
                      __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_5f8);
            Issue::IssueImpl::setDescription(peVar13->mPimpl,(string *)local_5c0);
            peVar13 = std::
                      __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_5f8);
            peVar14 = std::
                      __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&peVar13->mPimpl->mItem);
            AnyCellmlElement::AnyCellmlElementImpl::setUnits(peVar14->mPimpl,units);
            peVar13 = std::
                      __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_5f8);
            Issue::IssueImpl::setReferenceRule(peVar13->mPimpl,IMPORT_UNITS_UNITS_REFERENCE);
            Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_5f8);
            std::shared_ptr<libcellml::Issue>::~shared_ptr
                      ((shared_ptr<libcellml::Issue> *)local_5f8);
            std::__cxx11::string::~string((string *)local_5c0);
          }
          else {
            std::
            vector<std::shared_ptr<libcellml::Model>,_std::allocator<std::shared_ptr<libcellml::Model>_>_>
            ::push_back(modelsVisited,
                        (value_type *)
                        &importedUnits.
                         super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
            std::
            vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
            ::push_back(history,(value_type *)local_40);
            peVar12 = std::
                      __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_408);
            ImportSource::url_abi_cxx11_
                      ((string *)
                       &issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,peVar12);
            validateUnits(this,(UnitsPtr *)
                               &importUnitsNames.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,history,
                          modelsVisited,
                          (string *)
                          &issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
            std::__cxx11::string::~string
                      ((string *)
                       &issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::
            vector<std::shared_ptr<libcellml::Model>,_std::allocator<std::shared_ptr<libcellml::Model>_>_>
            ::pop_back(modelsVisited);
          }
          std::
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)((long)&description_1.field_2 + 8));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&importIssueList.
                        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&importUnitsImportSources.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&importUnitsRefs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else {
          Issue::IssueImpl::create();
          peVar13 = std::
                    __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_628);
          pIVar1 = peVar13->mPimpl;
          peVar6 = std::
                   __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)units);
          NamedEntity::name_abi_cxx11_(&local_708,&peVar6->super_NamedEntity);
          std::operator+(&local_6e8,"Imported units \'",&local_708);
          std::operator+(&local_6c8,&local_6e8,"\' refers to units \'");
          std::operator+(&local_6a8,&local_6c8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&unitsImportUrl.field_2 + 8));
          std::operator+(&local_688,&local_6a8,"\' which does not appear in \'");
          peVar12 = std::
                    __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_408);
          ImportSource::url_abi_cxx11_((string *)((long)&description_2.field_2 + 8),peVar12);
          std::operator+(&local_668,&local_688,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&description_2.field_2 + 8));
          std::operator+(&local_648,&local_668,"\'.");
          Issue::IssueImpl::setDescription(pIVar1,&local_648);
          std::__cxx11::string::~string((string *)&local_648);
          std::__cxx11::string::~string((string *)&local_668);
          std::__cxx11::string::~string((string *)(description_2.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)&local_688);
          std::__cxx11::string::~string((string *)&local_6a8);
          std::__cxx11::string::~string((string *)&local_6c8);
          std::__cxx11::string::~string((string *)&local_6e8);
          std::__cxx11::string::~string((string *)&local_708);
          peVar13 = std::
                    __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_628);
          peVar14 = std::
                    __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&peVar13->mPimpl->mItem);
          AnyCellmlElement::AnyCellmlElementImpl::setUnits(peVar14->mPimpl,units);
          peVar13 = std::
                    __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_628);
          Issue::IssueImpl::setReferenceRule
                    (peVar13->mPimpl,IMPORT_UNITS_UNITS_REFERENCE_VALUE_TARGET);
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_628);
          std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_628);
        }
        std::shared_ptr<libcellml::Units>::~shared_ptr
                  ((shared_ptr<libcellml::Units> *)
                   &importUnitsNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      std::shared_ptr<libcellml::Model>::~shared_ptr
                ((shared_ptr<libcellml::Model> *)
                 &importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::shared_ptr<libcellml::ImportSource>::~shared_ptr
                ((shared_ptr<libcellml::ImportSource> *)local_408);
    }
    if (1 < unitsWithImportSource) {
      peVar9 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_2b0);
      NamedEntity::name_abi_cxx11_
                ((string *)
                 &issue_5.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(NamedEntity *)peVar9);
      std::operator+(&local_7a8,"Model \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &issue_5.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
      std::operator+(&local_788,&local_7a8,"\' contains multiple units with the name \'");
      std::operator+(&local_768,&local_788,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &initialIssueCount);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_748,
                     &local_768,"\'. Valid units names must be unique to their model.");
      std::__cxx11::string::~string((string *)&local_768);
      std::__cxx11::string::~string((string *)&local_788);
      std::__cxx11::string::~string((string *)&local_7a8);
      std::__cxx11::string::~string
                ((string *)
                 &issue_5.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      bVar3 = checkIssuesForDuplications(this,(string *)local_748);
      if (!bVar3) {
        Issue::IssueImpl::create();
        peVar13 = std::
                  __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&issue_6.
                                 super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount);
        Issue::IssueImpl::setDescription(peVar13->mPimpl,(string *)local_748);
        peVar13 = std::
                  __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&issue_6.
                                 super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount);
        peVar14 = std::
                  __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&peVar13->mPimpl->mItem);
        AnyCellmlElement::AnyCellmlElementImpl::setModel
                  (peVar14->mPimpl,(ModelPtr *)local_2b0,MODEL);
        peVar6 = std::
                 __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)units);
        bVar3 = ImportedEntity::isImport(&peVar6->super_ImportedEntity);
        if (bVar3) {
          peVar13 = std::
                    __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&issue_6.
                                     super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount);
          Issue::IssueImpl::setReferenceRule(peVar13->mPimpl,IMPORT_UNITS_NAME_UNIQUE);
        }
        else {
          peVar13 = std::
                    __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&issue_6.
                                     super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount);
          Issue::IssueImpl::setReferenceRule(peVar13->mPimpl,UNITS_NAME_UNIQUE);
        }
        Logger::LoggerImpl::addIssue
                  (&this->super_LoggerImpl,
                   (IssuePtr *)
                   &issue_6.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::shared_ptr<libcellml::Issue>::~shared_ptr
                  ((shared_ptr<libcellml::Issue> *)
                   &issue_6.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      std::__cxx11::string::~string((string *)local_748);
    }
    bVar3 = isCellmlIdentifier((string *)&initialIssueCount);
    if (bVar3) {
      bVar3 = isStandardUnitName((string *)&initialIssueCount);
      if (bVar3) {
        Issue::IssueImpl::create();
        peVar13 = std::
                  __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_8f8);
        pIVar1 = peVar13->mPimpl;
        std::operator+(&local_938,"Units is named \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &initialIssueCount);
        std::operator+(&local_918,&local_938,"\' which is a protected standard unit name.");
        Issue::IssueImpl::setDescription(pIVar1,&local_918);
        std::__cxx11::string::~string((string *)&local_918);
        std::__cxx11::string::~string((string *)&local_938);
        peVar13 = std::
                  __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_8f8);
        peVar14 = std::
                  __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&peVar13->mPimpl->mItem);
        AnyCellmlElement::AnyCellmlElementImpl::setUnits(peVar14->mPimpl,units);
        peVar13 = std::
                  __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_8f8);
        Issue::IssueImpl::setReferenceRule(peVar13->mPimpl,UNITS_STANDARD);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_8f8);
        std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_8f8);
      }
    }
    else {
      makeIssueIllegalIdentifier((ValidatorImpl *)local_7e8,(string *)this);
      peVar13 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_7e8);
      peVar14 = std::
                __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&peVar13->mPimpl->mItem);
      AnyCellmlElement::AnyCellmlElementImpl::setUnits(peVar14->mPimpl,units);
      peVar6 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)units);
      bVar3 = ImportedEntity::isImport(&peVar6->super_ImportedEntity);
      if (bVar3) {
        peVar13 = std::
                  __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_7e8);
        pIVar1 = peVar13->mPimpl;
        std::operator+(&local_848,"Imported units \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &initialIssueCount);
        std::operator+(&local_828,&local_848,"\' does not have a valid name attribute. ");
        peVar13 = std::
                  __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_7e8);
        Issue::description_abi_cxx11_(&local_868,peVar13);
        std::operator+(&local_808,&local_828,&local_868);
        Issue::IssueImpl::setDescription(pIVar1,&local_808);
        std::__cxx11::string::~string((string *)&local_808);
        std::__cxx11::string::~string((string *)&local_868);
        std::__cxx11::string::~string((string *)&local_828);
        std::__cxx11::string::~string((string *)&local_848);
        peVar13 = std::
                  __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_7e8);
        Issue::IssueImpl::setReferenceRule(peVar13->mPimpl,IMPORT_UNITS_NAME_VALUE);
      }
      else {
        peVar13 = std::
                  __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_7e8);
        pIVar1 = peVar13->mPimpl;
        std::operator+(&local_8c8,"Units \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &initialIssueCount);
        std::operator+(&local_8a8,&local_8c8,"\' does not have a valid name attribute. ");
        peVar13 = std::
                  __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_7e8);
        Issue::description_abi_cxx11_
                  ((string *)
                   &issue_7.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,peVar13);
        std::operator+(&local_888,&local_8a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &issue_7.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
        Issue::IssueImpl::setDescription(pIVar1,&local_888);
        std::__cxx11::string::~string((string *)&local_888);
        std::__cxx11::string::~string
                  ((string *)
                   &issue_7.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__cxx11::string::~string((string *)&local_8a8);
        std::__cxx11::string::~string((string *)&local_8c8);
        peVar13 = std::
                  __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_7e8);
        Issue::IssueImpl::setReferenceRule(peVar13->mPimpl,UNITS_NAME_VALUE);
      }
      Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_7e8);
      std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_7e8);
    }
    peVar6 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)units);
    Entity::id_abi_cxx11_
              ((string *)
               &issue_8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,(Entity *)peVar6);
    bVar3 = isValidXmlName((string *)
                           &issue_8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
    std::__cxx11::string::~string
              ((string *)
               &issue_8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      Issue::IssueImpl::create();
      peVar13 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)(descriptionStart.field_2._M_local_buf + 8));
      Issue::IssueImpl::setReferenceRule(peVar13->mPimpl,XML_ID_ATTRIBUTE);
      peVar13 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)(descriptionStart.field_2._M_local_buf + 8));
      peVar14 = std::
                __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&peVar13->mPimpl->mItem);
      AnyCellmlElement::AnyCellmlElementImpl::setUnits(peVar14->mPimpl,units);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_988,"Units",&local_989);
      std::allocator<char>::~allocator(&local_989);
      peVar6 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)units);
      bVar3 = ImportedEntity::isImport(&peVar6->super_ImportedEntity);
      if (bVar3) {
        std::__cxx11::string::operator=((string *)local_988,"Imported units");
      }
      peVar13 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)(descriptionStart.field_2._M_local_buf + 8));
      pIVar1 = peVar13->mPimpl;
      std::operator+(&local_a30,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_988,
                     " \'");
      std::operator+(&local_a10,&local_a30,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &initialIssueCount);
      std::operator+(&local_9f0,&local_a10,"\' does not have a valid \'id\' attribute, \'");
      peVar6 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)units);
      Entity::id_abi_cxx11_((string *)&i_1,(Entity *)peVar6);
      std::operator+(&local_9d0,&local_9f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1);
      std::operator+(&local_9b0,&local_9d0,"\'.");
      Issue::IssueImpl::setDescription(pIVar1,&local_9b0);
      std::__cxx11::string::~string((string *)&local_9b0);
      std::__cxx11::string::~string((string *)&local_9d0);
      std::__cxx11::string::~string((string *)&i_1);
      std::__cxx11::string::~string((string *)&local_9f0);
      std::__cxx11::string::~string((string *)&local_a10);
      std::__cxx11::string::~string((string *)&local_a30);
      Logger::LoggerImpl::addIssue
                (&this->super_LoggerImpl,(IssuePtr *)((long)&descriptionStart.field_2 + 8));
      std::__cxx11::string::~string((string *)local_988);
      std::shared_ptr<libcellml::Issue>::~shared_ptr
                ((shared_ptr<libcellml::Issue> *)((long)&descriptionStart.field_2 + 8));
    }
    peVar6 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)units);
    sVar15 = Units::unitCount(peVar6);
    if (sVar15 != 0) {
      std::
      vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
      ::push_back(history,(value_type *)local_40);
      local_a58 = 0;
      while( true ) {
        uVar5 = local_a58;
        peVar6 = std::
                 __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)units);
        sVar15 = Units::unitCount(peVar6);
        if (sVar15 <= uVar5) break;
        validateUnitsUnitsItem(this,local_a58,units,history,modelsVisited);
        local_a58 = local_a58 + 1;
      }
      std::
      vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
      ::pop_back(history);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a78,"Units",&local_a79);
    std::shared_ptr<libcellml::Component>::shared_ptr(&local_a90,(nullptr_t)0x0);
    handleErrorsFromImports
              (this,initialErrorCount,sVar7 == 1,&local_a78,(string *)&initialIssueCount,history,
               &local_a90,units);
    std::shared_ptr<libcellml::Component>::~shared_ptr(&local_a90);
    std::__cxx11::string::~string((string *)&local_a78);
    std::allocator<char>::~allocator(&local_a79);
    std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_2b0);
    std::__cxx11::string::~string((string *)local_200);
    std::__cxx11::string::~string((string *)(unitsImportUrl.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&initialIssueCount);
    unitsName.field_2._12_4_ = 0;
  }
  std::shared_ptr<libcellml::HistoryEpoch>::~shared_ptr
            ((shared_ptr<libcellml::HistoryEpoch> *)local_40);
  return;
}

Assistant:

void Validator::ValidatorImpl::validateUnits(const UnitsPtr &units, History &history, std::vector<ModelPtr> &modelsVisited, const std::string &sourceUrl)
{
    auto h = createHistoryEpoch(units, sourceUrl);
    if (checkForLocalCycles(history, h)) {
        history.push_back(h);
        std::string des;
        Strings names;
        for (const auto &entry : history) {
            if (!des.empty()) {
                des += " -> ";
            }
            auto tmp = "'" + entry->mName + "'";
            names.push_back(tmp);
            des += tmp;
        }
        if (!hasCycleAlreadyBeenReported(names)) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Cyclic units exist: " + des + ".");
            issue->mPimpl->mItem->mPimpl->setUnits(units);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNIT_UNITS_CIRCULAR_REFERENCE);
            addIssue(issue);
        }
        history.pop_back();
        return;
    }

    std::string unitsName = units->name();
    size_t initialIssueCount = mValidator->issueCount();
    bool isOriginatingModel = modelsVisited.size() == 1;

    std::string unitsRef;
    std::string unitsImportUrl;
    if (units->isImport()) {
        unitsRef = units->importReference();
        unitsImportUrl = units->importSource()->url();
        h->mReferenceName = unitsRef;
        h->mSourceUrl = importeeModelUrl(history, units->importSource()->url());
    }

    auto model = owningModel(units);

    size_t unitsWithNameCount = 0;
    size_t unitsWithImportSource = 0;
    for (size_t i = 0; (i < model->unitsCount()) && (modelsVisited.size() == 1); ++i) {
        auto tmpUnits = model->units(i);
        if (tmpUnits->name() == unitsName) {
            unitsWithNameCount += 1;
        }
        if (tmpUnits->isImport()) {
            if (tmpUnits->importReference() == unitsRef && tmpUnits->importSource()->url() == unitsImportUrl) {
                unitsWithImportSource += 1;
            }
        }
    }

    if (units->isImport()) {
        // Check for a units_ref.
        size_t currentIssueCount = mValidator->issueCount();
        if (!isCellmlIdentifier(unitsRef)) {
            auto issue = makeIssueIllegalIdentifier(unitsRef);
            issue->mPimpl->setDescription("Imported units '" + unitsName + "' does not have a valid units_ref attribute. " + issue->description());
            issue->mPimpl->mItem->mPimpl->setUnits(units);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_UNITS_UNITS_REFERENCE_VALUE);
            addIssue(issue);
        }

        auto importSource = units->importSource();
        validateImportSource(importSource, unitsName, "units");

        bool foundImportIssue = mValidator->issueCount() > currentIssueCount;

        // Check if we already have another import from the same source with the same units_ref.
        // (This looks for matching entries at the same position in the source and ref vectors).
        if (!foundImportIssue && (unitsWithImportSource > 1)) {
            auto description = "Model '" + model->name() + "' contains multiple imported units from '" + unitsImportUrl + "' with the same units_ref attribute '" + unitsRef + "'.";
            if (!checkIssuesForDuplications(description)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription(description);
                issue->mPimpl->mItem->mPimpl->setModel(model);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_UNITS_UNITS_REFERENCE);
                addIssue(issue);
            }
        }

        auto importSourceModel = importSource->model();
        if (importSourceModel != nullptr) {
            auto importedUnits = importSourceModel->units(unitsRef);
            if (importedUnits != nullptr) {
                Strings importUnitsNames;
                Strings importUnitsRefs;
                Strings importUnitsImportSources;
                IssuesList importIssueList;

                if (checkForImportCycles(history, h)) {
                    history.push_back(h);
                    auto description = formDescriptionOfCyclicDependency(history, "resolve");
                    IssuePtr issue = Issue::IssueImpl::create();
                    issue->mPimpl->setDescription(description);
                    issue->mPimpl->mItem->mPimpl->setUnits(units);
                    issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_UNITS_UNITS_REFERENCE);
                    addIssue(issue);
                } else {
                    modelsVisited.push_back(importSourceModel);
                    history.push_back(h);
                    validateUnits(importedUnits, history, modelsVisited, importSource->url());
                    modelsVisited.pop_back();
                }
            } else {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Imported units '" + units->name() + "' refers to units '" + unitsRef + "' which does not appear in '" + importSource->url() + "'.");
                issue->mPimpl->mItem->mPimpl->setUnits(units);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_UNITS_UNITS_REFERENCE_VALUE_TARGET);
                addIssue(issue);
            }
        }
    }
    // Check for duplicate units names in this model.
    if (unitsWithNameCount > 1) {
        std::string description = "Model '" + model->name() + "' contains multiple units with the name '" + unitsName + "'. Valid units names must be unique to their model.";
        if (!checkIssuesForDuplications(description)) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription(description);
            issue->mPimpl->mItem->mPimpl->setModel(model);
            if (units->isImport()) {
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_UNITS_NAME_UNIQUE);
            } else {
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNITS_NAME_UNIQUE);
            }

            addIssue(issue);
        }
    }
    // Check for a valid name attribute.
    if (!isCellmlIdentifier(unitsName)) {
        auto issue = makeIssueIllegalIdentifier(unitsName);
        issue->mPimpl->mItem->mPimpl->setUnits(units);
        if (units->isImport()) {
            issue->mPimpl->setDescription("Imported units '" + unitsName + "' does not have a valid name attribute. " + issue->description());
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_UNITS_NAME_VALUE);
        } else {
            issue->mPimpl->setDescription("Units '" + unitsName + "' does not have a valid name attribute. " + issue->description());
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNITS_NAME_VALUE);
        }
        addIssue(issue);
    } else {
        // Check for a matching standard units.
        if (isStandardUnitName(unitsName)) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Units is named '" + unitsName + "' which is a protected standard unit name.");
            issue->mPimpl->mItem->mPimpl->setUnits(units);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNITS_STANDARD);
            addIssue(issue);
        }
    }
    // Check for a valid identifier.
    if (!isValidXmlName(units->id())) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_ID_ATTRIBUTE);
        issue->mPimpl->mItem->mPimpl->setUnits(units);
        std::string descriptionStart = "Units";
        if (units->isImport()) {
            descriptionStart = "Imported units";
        }
        issue->mPimpl->setDescription(descriptionStart + " '" + unitsName + "' does not have a valid 'id' attribute, '" + units->id() + "'.");
        addIssue(issue);
    }

    if (units->unitCount() > 0) {
        history.push_back(h);
        for (size_t i = 0; i < units->unitCount(); ++i) {
            validateUnitsUnitsItem(i, units, history, modelsVisited);
        }
        history.pop_back();
    }

    handleErrorsFromImports(initialIssueCount, isOriginatingModel, "Units", unitsName, history, nullptr, units);
}